

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtilities.cpp
# Opt level: O2

int Rml::FormatString(String *string,char *format,__va_list_tag *argument_list)

{
  code *pcVar1;
  byte bVar2;
  bool bVar3;
  uint uVar4;
  char *__s;
  ulong __maxlen;
  va_list argument_list_copy;
  char buffer [256];
  
  __maxlen = 0x100;
  __s = buffer;
  bVar2 = 0;
  while( true ) {
    argument_list_copy[0].reg_save_area = argument_list->reg_save_area;
    argument_list_copy[0].gp_offset = argument_list->gp_offset;
    argument_list_copy[0].fp_offset = argument_list->fp_offset;
    argument_list_copy[0].overflow_arg_area = argument_list->overflow_arg_area;
    uVar4 = vsnprintf(__s,__maxlen,format,argument_list_copy);
    if ((int)uVar4 < 0) {
      bVar3 = Assert("Error while formatting string",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/StringUtilities.cpp"
                     ,0x3c);
      if (bVar3) {
        return 0;
      }
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    if ((bool)(bVar2 | uVar4 < __maxlen)) break;
    __maxlen = (ulong)uVar4 + 1;
    __s = (char *)operator_new__(__maxlen);
    bVar2 = 1;
  }
  ::std::__cxx11::string::assign((char *)string);
  if (__s == buffer) {
    return uVar4;
  }
  operator_delete__(__s);
  return uVar4;
}

Assistant:

static int FormatString(String& string, const char* format, va_list argument_list)
{
	constexpr size_t InternalBufferSize = 256;
	char buffer[InternalBufferSize];
	char* buffer_ptr = buffer;

	size_t max_size = InternalBufferSize;
	int length = 0;

	for (int i = 0; i < 2; i++)
	{
		va_list argument_list_copy;
		va_copy(argument_list_copy, argument_list);

		length = vsnprintf(buffer_ptr, max_size, format, argument_list_copy);

		va_end(argument_list_copy);

		if (length < 0)
		{
			RMLUI_ERRORMSG("Error while formatting string");
			return 0;
		}

		if ((size_t)length < max_size || i > 0)
			break;

		max_size = (size_t)length + 1;
		buffer_ptr = new char[max_size];
	}

	string = buffer_ptr;

	if (buffer_ptr != buffer)
		delete[] buffer_ptr;

	return length;
}